

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

double __thiscall
QHybrid::ComputeRecursively(QHybrid *this,size_t time_step,LIndex jaohI,Index lastJAI)

{
  _func_int *p_Var1;
  bool bVar2;
  BayesianGameIdenticalPayoff *this_00;
  long *nrAgents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  size_t sVar4;
  LIndex i;
  undefined8 uVar5;
  undefined4 in_ECX;
  ulong uVar6;
  size_t in_RDX;
  QHybrid *in_RSI;
  long *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> *in_stack_00000108;
  double Vbg;
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs;
  int nrSolutionsWanted;
  int BGsolverVerbose;
  double exp_fut_R;
  double prob_s_1;
  double r_s_ja_1;
  BeliefIteratorGeneric it_1;
  double exp_imm_R;
  double Q_1;
  Index newJAI;
  double maxQ;
  double Po_ba;
  JointBeliefInterface *new_jbi;
  Index new_jaohI;
  Index newJOI;
  double discount;
  double Vpomdp;
  BGIP_sharedPtr bg_time_step;
  double prob_s;
  double r_s_ja;
  BeliefIteratorGeneric it;
  JointBeliefInterface *jbi;
  double Q;
  bool last_t;
  size_type in_stack_fffffffffffffc38;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffc40;
  shared_ptr<BayesianGameIdenticalPayoff> *in_stack_fffffffffffffc48;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> *nrDesiredSolutions;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  int iVar19;
  BayesianGameIdenticalPayoff *in_stack_fffffffffffffc58;
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> *in_stack_fffffffffffffc60;
  _func_int **in_stack_fffffffffffffc68;
  E *in_stack_fffffffffffffc70;
  double in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  size_t in_stack_fffffffffffffcb0;
  ulong in_stack_fffffffffffffcb8;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffcc0;
  double in_stack_fffffffffffffcd0;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffcd8;
  undefined1 useSparseRewardModel;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_248 [20];
  undefined4 local_100;
  undefined4 local_fc;
  double local_f8;
  double local_f0;
  double local_e8;
  undefined1 local_e0 [16];
  ulong local_d0;
  _func_int **local_c8;
  uint local_bc;
  _func_int **local_b8;
  double local_b0;
  BayesianGameIdenticalPayoff *local_a8;
  Index local_a0;
  uint local_9c;
  double local_98;
  double local_90;
  shared_ptr<BayesianGameIdenticalPayoff> local_78;
  double local_68;
  double local_50;
  undefined1 local_48 [16];
  JointBeliefInterface *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  uint3 in_stack_ffffffffffffffd8;
  uint uVar20;
  double local_8;
  
  uVar20 = (uint)in_stack_ffffffffffffffd8;
  if (in_RSI == (QHybrid *)in_RDI[10]) {
    uVar20 = CONCAT13(1,in_stack_ffffffffffffffd8);
  }
  if (((char)(uVar20 >> 0x18) == '\0') || (in_RDI[8] != 0)) {
    boost::shared_ptr<BayesianGameIdenticalPayoff>::shared_ptr
              ((shared_ptr<BayesianGameIdenticalPayoff> *)0x8a43d2);
    auVar9._0_8_ = in_stack_fffffffffffffc78;
    if ((int)in_RDI[7] == 2) {
      this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
      nrAgents = (long *)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                                   ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  (**(code **)(*nrAgents + 0x30))();
      nrTypes = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                          ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      pvVar3 = PlanningUnitMADPDiscrete::GetNrActions((PlanningUnitMADPDiscrete *)0x8a4478);
      useSparseRewardModel = (undefined1)((ulong)pvVar3 >> 0x38);
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      PlanningUnitMADPDiscrete::GetNrObservations((PlanningUnitMADPDiscrete *)0x8a44bb);
      BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
                (this_00,(size_t)nrAgents,nrActions,nrTypes,(bool)useSparseRewardModel);
      boost::shared_ptr<BayesianGameIdenticalPayoff>::shared_ptr<BayesianGameIdenticalPayoff>
                ((shared_ptr<BayesianGameIdenticalPayoff> *)in_stack_fffffffffffffc60,
                 in_stack_fffffffffffffc58);
      boost::shared_ptr<BayesianGameIdenticalPayoff>::operator=
                ((shared_ptr<BayesianGameIdenticalPayoff> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      boost::shared_ptr<BayesianGameIdenticalPayoff>::~shared_ptr
                ((shared_ptr<BayesianGameIdenticalPayoff> *)0x8a4528);
      auVar9._0_8_ = in_stack_fffffffffffffc78;
    }
    local_90 = 0.0;
    (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
              ((long)in_RDI + *(long *)(*in_RDI + -0x88));
    local_98 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8a45b3);
    local_9c = 0;
    while( true ) {
      uVar6 = (ulong)local_9c;
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      sVar4 = PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x8a4623)
      ;
      if (sVar4 <= uVar6) break;
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      i = PlanningUnitMADPDiscrete::GetSuccessorJAOHI
                    (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     (Index)(in_stack_fffffffffffffcb0 >> 0x20),(Index)in_stack_fffffffffffffcb0);
      local_a0 = Globals::CastLIndexToIndex(i);
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      local_a8 = (BayesianGameIdenticalPayoff *)
                 PlanningUnitMADPDiscrete::GetJointBeliefInterface
                           (in_stack_fffffffffffffcd8,(LIndex)in_stack_fffffffffffffcd0);
      in_stack_fffffffffffffcd8 =
           (PlanningUnitMADPDiscrete *)
           (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                     ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      in_stack_fffffffffffffcd0 =
           PlanningUnitMADPDiscrete::GetJAOHProbGivenPred
                     (in_stack_fffffffffffffcd8,(LIndex)in_stack_fffffffffffffcd0);
      local_b0 = in_stack_fffffffffffffcd0;
      if (1e-12 <= in_stack_fffffffffffffcd0) {
        if ((int)in_RDI[7] == 2) {
          boost::shared_ptr<BayesianGameIdenticalPayoff>::operator->(&local_78);
          BayesianGameBase::SetProbability
                    ((BayesianGameBase *)
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                     (Index)((ulong)auVar9._0_8_ >> 0x20),(double)in_stack_fffffffffffffc70);
        }
        local_b8 = (_func_int **)0xffefffffffffffff;
        local_bc = 0;
        while( true ) {
          in_stack_fffffffffffffcb8 = (ulong)local_bc;
          in_stack_fffffffffffffcc0 =
               (PlanningUnitMADPDiscrete *)
               (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                         ((long)in_RDI + *(long *)(*in_RDI + -0x88));
          in_stack_fffffffffffffcb0 =
               PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8a4840);
          if (in_stack_fffffffffffffcb0 <= in_stack_fffffffffffffcb8) break;
          local_c8 = (_func_int **)0x0;
          if ((uVar20 & 0x1000000) == 0) {
            local_d0 = 0;
            p_Var1 = (local_a8->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                     super_Interface_ProblemToPolicyDiscretePure.
                     super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete
                     [-0x17];
            (**(code **)(*(long *)(p_Var1 + (long)&(local_a8->
                                                   super_BayesianGameIdenticalPayoffInterface).
                                                   super_BayesianGameBase.
                                                   super_Interface_ProblemToPolicyDiscretePure.
                                                   super_Interface_ProblemToPolicyDiscrete.
                                                   _vptr_Interface_ProblemToPolicyDiscrete) + 0x98))
                      (local_e0,p_Var1 + (long)&(local_a8->
                                                super_BayesianGameIdenticalPayoffInterface).
                                                super_BayesianGameBase.
                                                super_Interface_ProblemToPolicyDiscretePure.
                                                super_Interface_ProblemToPolicyDiscrete.
                                                _vptr_Interface_ProblemToPolicyDiscrete);
            do {
              (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                        ((long)in_RDI + *(long *)(*in_RDI + -0x88));
              BeliefIteratorGeneric::GetStateIndex((BeliefIteratorGeneric *)0x8a4929);
              local_e8 = PlanningUnitDecPOMDPDiscrete::GetReward
                                   (in_stack_fffffffffffffc40,
                                    (Index)(in_stack_fffffffffffffc38 >> 0x20),
                                    (Index)in_stack_fffffffffffffc38);
              auVar8._0_8_ = BeliefIteratorGeneric::GetProbability
                                       ((BeliefIteratorGeneric *)0x8a4968);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = local_e8;
              auVar8._8_8_ = 0;
              auVar16._8_8_ = 0;
              auVar16._0_8_ = local_d0;
              auVar9 = vfmadd213sd_fma(auVar8,auVar12,auVar16);
              local_d0 = auVar9._0_8_;
              local_f0 = auVar8._0_8_;
              in_stack_fffffffffffffc87 =
                   BeliefIteratorGeneric::Next((BeliefIteratorGeneric *)0x8a49b5);
            } while ((bool)in_stack_fffffffffffffc87);
            auVar9._0_8_ = ComputeRecursively(in_RSI,in_RDX,CONCAT44(in_ECX,uVar20),
                                              (Index)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
            auVar17._8_8_ = 0;
            auVar17._0_8_ = local_d0;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = local_98;
            auVar9._8_8_ = 0;
            auVar10 = vfmadd213sd_fma(auVar9,auVar13,auVar17);
            local_c8 = auVar10._0_8_;
            local_f8 = auVar9._0_8_;
            BeliefIteratorGeneric::~BeliefIteratorGeneric
                      ((BeliefIteratorGeneric *)in_stack_fffffffffffffc40);
          }
          else {
            local_c8 = (_func_int **)
                       (**(code **)(*(long *)in_RDI[8] + 0x70))
                                 ((long *)in_RDI[8],local_a8,0,local_bc);
          }
          if ((ulong)local_a0 < (ulong)in_RDI[0xb]) {
            in_stack_fffffffffffffc68 = local_c8;
            in_stack_fffffffffffffc70 =
                 (E *)boost::numeric::ublas::
                      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                    *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,0x8a4aad);
            in_stack_fffffffffffffc70->_vptr_E = in_stack_fffffffffffffc68;
          }
          if ((double)local_b8 < (double)local_c8) {
            local_b8 = local_c8;
          }
          if ((int)in_RDI[7] == 2) {
            in_stack_fffffffffffffc60 =
                 (BGIP_SolverBruteForceSearch<JointPolicyPureVector> *)
                 boost::shared_ptr<BayesianGameIdenticalPayoff>::operator->(&local_78);
            BayesianGameIdenticalPayoff::SetUtility
                      ((BayesianGameIdenticalPayoff *)in_stack_fffffffffffffc40,
                       (Index)(in_stack_fffffffffffffc38 >> 0x20),(Index)in_stack_fffffffffffffc38,
                       4.47782169017614e-317);
          }
          local_bc = local_bc + 1;
        }
        in_stack_fffffffffffffc58 = local_a8;
        if (local_a8 != (BayesianGameIdenticalPayoff *)0x0) {
          (*(local_a8->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[1])();
        }
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_b0;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_b8;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_90;
        auVar10 = vfmadd213sd_fma(auVar10,auVar14,auVar18);
        local_90 = auVar10._0_8_;
      }
      local_9c = local_9c + 1;
    }
    iVar19 = (int)in_RDI[7];
    if (iVar19 == 1) {
      local_8 = local_90;
    }
    else {
      if (iVar19 != 2) {
        uVar5 = __cxa_allocate_exception(0x28);
        E::E(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
        __cxa_throw(uVar5,&E::typeinfo,E::~E);
      }
      local_fc = 0;
      local_100 = 1;
      nrDesiredSolutions = local_248;
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::
      shared_ptr<BayesianGameIdenticalPayoff>(nrDesiredSolutions,&local_78);
      BGIP_SolverBruteForceSearch<JointPolicyPureVector>::BGIP_SolverBruteForceSearch
                (in_stack_fffffffffffffc60,
                 (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)in_stack_fffffffffffffc58
                 ,CONCAT44(iVar19,in_stack_fffffffffffffc50),(size_t)nrDesiredSolutions,
                 (size_t)in_stack_fffffffffffffc40);
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x8a4c34);
      local_8 = BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve(in_stack_00000108);
      BGIP_SolverBruteForceSearch<JointPolicyPureVector>::~BGIP_SolverBruteForceSearch
                ((BGIP_SolverBruteForceSearch<JointPolicyPureVector> *)0x8a4c82);
    }
    boost::shared_ptr<BayesianGameIdenticalPayoff>::~shared_ptr
              ((shared_ptr<BayesianGameIdenticalPayoff> *)0x8a4d59);
  }
  else {
    local_8 = 0.0;
    (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
              ((long)in_RDI + *(long *)(*in_RDI + -0x88));
    local_38 = PlanningUnitMADPDiscrete::GetJointBeliefInterface
                         (in_stack_fffffffffffffcd8,(LIndex)in_stack_fffffffffffffcd0);
    (**(code **)(*(long *)(&local_38->field_0x0 + *(long *)((long)*local_38 + -0xb8)) + 0x98))
              (local_48,&local_38->field_0x0 + *(long *)((long)*local_38 + -0xb8));
    do {
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      BeliefIteratorGeneric::GetStateIndex((BeliefIteratorGeneric *)0x8a429c);
      local_50 = PlanningUnitDecPOMDPDiscrete::GetReward
                           (in_stack_fffffffffffffc40,(Index)(in_stack_fffffffffffffc38 >> 0x20),
                            (Index)in_stack_fffffffffffffc38);
      auVar7._0_8_ = BeliefIteratorGeneric::GetProbability((BeliefIteratorGeneric *)0x8a42ea);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_50;
      auVar7._8_8_ = 0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_8;
      auVar9 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
      local_8 = auVar9._0_8_;
      local_68 = auVar7._0_8_;
      bVar2 = BeliefIteratorGeneric::Next((BeliefIteratorGeneric *)0x8a433d);
    } while (bVar2);
    if (local_38 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*local_38 + 8))();
    }
    BeliefIteratorGeneric::~BeliefIteratorGeneric
              ((BeliefIteratorGeneric *)in_stack_fffffffffffffc40);
  }
  return local_8;
}

Assistant:

double QHybrid::ComputeRecursively(size_t time_step,
                                   LIndex jaohI,
                                   Index lastJAI)
{
    bool last_t = false;
    if( time_step == _m_horizonFirstTimeSteps )
        last_t = true;

    // we don't have a vector-based representation, so at the last
    // time step just return the immediate reward
    if(last_t && !_m_QlastTimeSteps)
    {
        double Q=0.0;
        JointBeliefInterface* jbi =
            GetPU()->GetJointBeliefInterface(jaohI);
        BeliefIteratorGeneric it=jbi->GetIterator();
        do
        {
            double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), lastJAI);
            double prob_s = it.GetProbability();
            Q += r_s_ja * prob_s;
        } while(it.Next());
        delete jbi;
        return(Q);
    }

    BGIP_sharedPtr bg_time_step;
    if(_m_QheurTypeFirstTS==eQBG)
        bg_time_step=BGIP_sharedPtr(
            new BayesianGameIdenticalPayoff(
                GetPU()->GetNrAgents(), 
                GetPU()->GetNrActions(),
                GetPU()->GetNrObservations()));
            
    double Vpomdp = 0.0;
    double discount = GetPU()->GetDiscount();

    for(Index newJOI=0; newJOI < GetPU()->GetNrJointObservations(); newJOI++)
    {
        Index new_jaohI = CastLIndexToIndex(
            GetPU()->GetSuccessorJAOHI(jaohI, lastJAI, newJOI));

        //get the new joint belief at this time-step resulting from lastJAI, 
        //newJOI...(the true prob. dist over states for the actions and obser-
        //vations as given by the history < jaoh, lastJA, newJOI > )
        
        JointBeliefInterface* new_jbi =
            GetPU()->GetJointBeliefInterface(new_jaohI);
        double Po_ba = GetPU()->GetJAOHProbGivenPred(new_jaohI);

        // if the probability of this observation occurring is zero,
        // the belief is not defined, and don't have to consider this
        // part of the tree anymore
        if(Po_ba<PROB_PRECISION)
            continue;

        if(_m_QheurTypeFirstTS==eQBG)
            bg_time_step->SetProbability(newJOI, Po_ba);

        //for all joint actions newJA
        double maxQ = -DBL_MAX;
        for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
        {
            double Q=0.0;
            if(last_t)
                Q = _m_QlastTimeSteps->GetQ(*new_jbi, 0, newJAI);
            else
            {
                //calculate R(joah',newJA) - expected immediate reward for time_step
                double exp_imm_R = 0.0;
                BeliefIteratorGeneric it=new_jbi->GetIterator();
                do
                {
                    double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                    double prob_s = it.GetProbability();
                    exp_imm_R += r_s_ja * prob_s;
                } while(it.Next());

                double exp_fut_R = ComputeRecursively(time_step+1, new_jaohI, newJAI);
                Q = exp_imm_R + discount * exp_fut_R;
            }
            if(new_jaohI<_m_nrJAOHinFirstTS)
                _m_QValuesFirstTimeSteps(new_jaohI,newJAI)=Q;
            if(Q > maxQ)
                maxQ = Q;
            if(_m_QheurTypeFirstTS==eQBG)
                bg_time_step->SetUtility(newJOI, newJAI, Q);
        }//end for newJAI
        
        //joint belief no longer needed:
        delete new_jbi;

        Vpomdp += Po_ba * maxQ;

    }//end for newJOI

    switch(_m_QheurTypeFirstTS)
    {
    case eQBG:
    {
        //solve this bayesian game, asking for only 1 solution
        int BGsolverVerbose=0;
        int nrSolutionsWanted=1;       
#if USE_BNB_SOLVER       
        BGIP_SolverBranchAndBound<JointPolicyPureVector> bgs(bg_time_step,
                                                             BGsolverVerbose,nrSolutionsWanted,
                                                             false,
                                                             BGIP_BnB::DescendingProbability,
                                                             false); // at least for boxPushing CCI was slower
#else
        BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs(bg_time_step,BGsolverVerbose,nrSolutionsWanted);
#endif
        double Vbg = bgs.Solve();
        return(Vbg);
    }
    case eQPOMDP:
    {
        return(Vpomdp);
    }
    default:
        throw(E("QHybrid: invalid Qheuristic for first time steps"));
    }
    return(42);
}